

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

void Cec_GiaSplitExplore(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  int Counter;
  int i;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  pObj = (Gia_Obj_t *)p;
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSplit.c"
                  ,0x96,"void Cec_GiaSplitExplore(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    *(undefined8 *)&pObj[8].Value = 0;
  }
  Gia_ManCreateRefs((Gia_Man_t *)pObj);
  local_2c = 0;
  do {
    bVar6 = false;
    if (local_2c < *(int *)(pObj + 2)) {
      pFan0 = Gia_ManObj((Gia_Man_t *)pObj,local_2c);
      bVar6 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) {
      return;
    }
    iVar2 = Gia_ObjIsAnd(pFan0);
    if ((iVar2 != 0) &&
       (iVar2 = Gia_ObjRecognizeExor(pFan0,&pFan1,(Gia_Obj_t **)&Counter), pGVar1 = pObj, iVar2 != 0
       )) {
      pGVar5 = Gia_ObjFanin0(pFan0);
      iVar2 = Gia_ObjRefNum((Gia_Man_t *)pGVar1,pGVar5);
      pGVar1 = pObj;
      if (1 < iVar2) {
        pGVar5 = Gia_ObjFanin1(pFan0);
        iVar2 = Gia_ObjRefNum((Gia_Man_t *)pGVar1,pGVar5);
        if (1 < iVar2) goto LAB_0079f980;
      }
      printf("%5d : ");
      pGVar1 = pObj;
      pGVar5 = Gia_Regular(pFan1);
      uVar3 = Gia_ObjRefNum((Gia_Man_t *)pGVar1,pGVar5);
      pGVar1 = pObj;
      pGVar5 = Gia_Regular(_Counter);
      uVar4 = Gia_ObjRefNum((Gia_Man_t *)pGVar1,pGVar5);
      printf("%2d %2d    ",(ulong)uVar3,(ulong)uVar4);
      pGVar1 = pObj;
      pGVar5 = Gia_ObjFanin0(pFan0);
      uVar3 = Gia_ObjRefNum((Gia_Man_t *)pGVar1,pGVar5);
      pGVar1 = pObj;
      pGVar5 = Gia_ObjFanin1(pFan0);
      uVar4 = Gia_ObjRefNum((Gia_Man_t *)pGVar1,pGVar5);
      printf("%2d %2d  \n",(ulong)uVar3,(ulong)uVar4);
    }
LAB_0079f980:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void Cec_GiaSplitExplore( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFan0, * pFan1;
    int i, Counter = 0;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            continue;
        if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) > 1 && 
             Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > 1 )
             continue;
        printf( "%5d : ", Counter++ );
        printf( "%2d %2d    ", Gia_ObjRefNum(p, Gia_Regular(pFan0)),  Gia_ObjRefNum(p, Gia_Regular(pFan1)) );
        printf( "%2d %2d  \n", Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)), Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) );
    }
}